

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_twospirals.cpp
# Opt level: O0

int main(void)

{
  allocator<int> *paVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *t;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  byte bVar2;
  size_t nInputs;
  MakeNet *pMVar3;
  PlainTextNetworkWriter *this;
  ostream *poVar4;
  allocator local_4e9;
  string local_4e8 [32];
  PlainTextNetworkWriter local_4c8;
  ostream local_4c0 [8];
  ofstream nnfile;
  allocator local_2b9;
  string local_2b8 [8];
  string dumpfile;
  anon_class_32_4_38312b6f local_298;
  undefined1 local_278 [40];
  undefined1 local_250 [8];
  IntClassifier classifier;
  function<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
  local_220;
  MakeNet local_200;
  undefined1 local_1b8 [8];
  Net net;
  SquareAugmented SQUARE;
  vector<int,_std::allocator<int>_> local_168;
  allocator local_149;
  string local_148 [32];
  CSVReader local_128;
  undefined1 local_118 [8];
  LabeledDataset testset;
  vector<int,_std::allocator<int>_> local_b8;
  allocator local_89;
  string local_88 [32];
  CSVReader local_68;
  undefined1 local_58 [8];
  LabeledDataset trainset;
  
  trainset.outputs.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  notch::io::CSVReader::CSVReader(&local_68,',');
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"../datatwospirals-train.csv",&local_89);
  testset.outputs.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0xffffffff;
  paVar1 = (allocator<int> *)
           ((long)&testset.outputs.
                   super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  notch::core::std::allocator<int>::allocator(paVar1);
  __l_00._M_len = 1;
  __l_00._M_array =
       (iterator)
       ((long)&testset.outputs.
               super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  notch::core::std::vector<int,_std::allocator<int>_>::vector(&local_b8,__l_00,paVar1);
  notch::io::CSVReader::read((CSVReader *)local_58,(int)&local_68,local_88,(size_t)&local_b8);
  notch::core::std::vector<int,_std::allocator<int>_>::~vector(&local_b8);
  notch::core::std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&testset.outputs.
                     super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  notch::io::CSVReader::CSVReader(&local_128,',');
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"../datatwospirals-test.csv",&local_149);
  SQUARE.super_ADatasetTransformer._vptr_ADatasetTransformer._4_4_ = 0xffffffff;
  paVar1 = (allocator<int> *)((long)&SQUARE.super_ADatasetTransformer._vptr_ADatasetTransformer + 3)
  ;
  notch::core::std::allocator<int>::allocator(paVar1);
  __l._M_len = 1;
  __l._M_array = (iterator)((long)&SQUARE.super_ADatasetTransformer._vptr_ADatasetTransformer + 4);
  notch::core::std::vector<int,_std::allocator<int>_>::vector(&local_168,__l,paVar1);
  notch::io::CSVReader::read((CSVReader *)local_118,(int)&local_128,local_148,(size_t)&local_168);
  notch::core::std::vector<int,_std::allocator<int>_>::~vector(&local_168);
  notch::core::std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&SQUARE.super_ADatasetTransformer._vptr_ADatasetTransformer + 3));
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  t = &net.lossLayer.super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount;
  notch::pre::SquareAugmented::SquareAugmented((SquareAugmented *)t);
  notch::core::LabeledDataset::apply((LabeledDataset *)local_58,(ADatasetTransformer *)t);
  notch::core::LabeledDataset::apply
            ((LabeledDataset *)local_118,
             (ADatasetTransformer *)
             &net.lossLayer.super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  nInputs = notch::core::LabeledDataset::inputDim((LabeledDataset *)local_58);
  notch::core::MakeNet::MakeNet(&local_200,nInputs);
  pMVar3 = notch::core::MakeNet::addFC(&local_200,0x50,(Activation *)notch::core::scaledTanh);
  pMVar3 = notch::core::MakeNet::addFC(pMVar3,0x14,(Activation *)notch::core::scaledTanh);
  pMVar3 = notch::core::MakeNet::addFC(pMVar3,1,(Activation *)notch::core::scaledTanh);
  pMVar3 = notch::core::MakeNet::addL2Loss(pMVar3);
  std::
  function<void(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::default_delete<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>>&,std::valarray<float>&,int,int)>
  ::
  function<void(&)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::default_delete<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>>&,std::valarray<float>&,int,int),void>
            ((function<void(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::default_delete<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>>&,std::valarray<float>&,int,int)>
              *)&local_220,notch::core::Init::normalXavier);
  notch::core::MakeNet::init((MakeNet *)local_1b8,(EVP_PKEY_CTX *)pMVar3);
  notch::core::std::
  function<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
  ::~function(&local_220);
  notch::core::MakeNet::~MakeNet(&local_200);
  notch::core::AdaDelta::AdaDelta((AdaDelta *)&classifier.net,0.95,1e-06);
  notch::core::Net::setLearningPolicy((Net *)local_1b8,(ALearningPolicy *)&classifier.net);
  IntClassifier::IntClassifier((IntClassifier *)local_250,(Net *)local_1b8);
  local_278._0_4_ = 10000;
  local_298.classifier = (IntClassifier *)local_250;
  local_298.testset = (LabeledDataset *)local_118;
  local_298.net = (Net *)local_1b8;
  local_298.trainset = (LabeledDataset *)local_58;
  std::function<bool(int)>::function<main::__0,void>
            ((function<bool(int)> *)(local_278 + 8),&local_298);
  notch::core::SGD::train
            ((Net *)local_1b8,(LabeledDataset *)local_58,130000,(EpochCallback *)local_278,
             (IterationCallback *)notch::core::noIterationCallback);
  notch::core::EpochCallback::~EpochCallback((EpochCallback *)local_278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"demo_twospirals_network.txt",&local_2b9);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::ofstream::ofstream(local_4c0,local_2b8,0x10);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) != 0) {
    notch::io::PlainTextNetworkWriter::PlainTextNetworkWriter(&local_4c8,local_4c0);
    this = notch::io::PlainTextNetworkWriter::operator<<(&local_4c8,(Net *)local_1b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4e8,"\n",&local_4e9);
    notch::io::PlainTextNetworkWriter::operator<<(this,(string *)local_4e8);
    std::__cxx11::string::~string(local_4e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
    poVar4 = std::operator<<((ostream *)&std::cout,"wrote ");
    poVar4 = std::operator<<(poVar4,local_2b8);
    std::operator<<(poVar4,"\n");
  }
  std::ofstream::~ofstream(local_4c0);
  std::__cxx11::string::~string(local_2b8);
  notch::core::Net::~Net((Net *)local_1b8);
  notch::core::LabeledDataset::~LabeledDataset((LabeledDataset *)local_118);
  notch::core::LabeledDataset::~LabeledDataset((LabeledDataset *)local_58);
  return trainset.outputs.
         super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {
    auto trainset = CSVReader().read(PATH_TO_DATA "twospirals-train.csv");
    auto testset = CSVReader().read(PATH_TO_DATA "twospirals-test.csv");

    // with SQUARE: accuracy = 99.5% (130000 epochs on 4-80-20-1 NN, ~5 min)
    // without:     accuracy = 99.5% (50000 epochs on 2-50-50-50-50-10-1 NN, ~7 min)
    SquareAugmented SQUARE;
    trainset.apply(SQUARE);
    testset.apply(SQUARE);

    Net net = MakeNet(trainset.inputDim())
        .addFC(80, scaledTanh)
        .addFC(20, scaledTanh)
        .addFC(1, scaledTanh)
        .addL2Loss()
        .init();

    net.setLearningPolicy(AdaDelta());

    auto classifier = IntClassifier(net);

    SGD::train(net, trainset,
               130000 /* epochs */,
               EpochCallback { 10000, [&](int i) {
                   auto cm = classifier.test(testset); // confusion matrix
                   cout << "epoch "
                        << setw(6) << i << " "
                        << " train loss = "
                        << setprecision(3) << setw(5) << showpoint
                        << meanLoss(net, trainset)
                        << " test loss = "
                        << setprecision(3) << setw(5) << showpoint
                        << meanLoss(net, testset)
                        << " accuracy = "
                        << setprecision(3) << setw(5) << showpoint
                        << cm.accuracy()
                        << " F1 = "
                        << setprecision(3) << setw(5) << showpoint
                        << cm.F1score()
                        << endl;
                   return false;
               }});

    string dumpfile = "demo_twospirals_network.txt";
    ofstream nnfile(dumpfile);
    if (nnfile.is_open()) {
        PlainTextNetworkWriter(nnfile) << net << "\n";
        cout << "wrote " << dumpfile << "\n";
    }
}